

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,token *value)

{
  ostream *poVar1;
  Token local_250;
  string local_230;
  ostringstream local_210 [8];
  ostringstream ss_e;
  undefined1 local_98 [8];
  string s;
  Token local_70;
  undefined1 local_50 [8];
  StringData sdata;
  token *value_local;
  AsciiParser *this_local;
  
  sdata._40_8_ = value;
  tinyusdz::value::StringData::StringData((StringData *)local_50);
  s.field_2._M_local_buf[0xc] = MaybeTripleQuotedString(this,(StringData *)local_50);
  if ((bool)s.field_2._M_local_buf[0xc]) {
    Token::Token(&local_70,(string *)local_50);
    Token::operator=((Token *)sdata._40_8_,&local_70);
    Token::~Token(&local_70);
    this_local._7_1_ = 1;
  }
  s.field_2._13_3_ = 0;
  tinyusdz::value::StringData::~StringData((StringData *)local_50);
  if (s.field_2._12_4_ == 0) {
    ::std::__cxx11::string::string((string *)local_98);
    this_local._7_1_ = ReadStringLiteral(this,(string *)local_98);
    if ((bool)this_local._7_1_) {
      Token::Token(&local_250,(string *)local_98);
      Token::operator=((Token *)sdata._40_8_,&local_250);
      Token::~Token(&local_250);
      s.field_2._12_4_ = 1;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_210);
      poVar1 = ::std::operator<<((ostream *)local_210,"[error]");
      poVar1 = ::std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                );
      poVar1 = ::std::operator<<(poVar1,"[ASCII]");
      poVar1 = ::std::operator<<(poVar1,":");
      poVar1 = ::std::operator<<(poVar1,"ReadBasicType");
      poVar1 = ::std::operator<<(poVar1,"():");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x280);
      ::std::operator<<(poVar1," ");
      poVar1 = ::std::operator<<((ostream *)local_210,"Failed to parse string literal.");
      ::std::operator<<(poVar1,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_230);
      ::std::__cxx11::string::~string((string *)&local_230);
      s.field_2._12_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_210);
    }
    ::std::__cxx11::string::~string((string *)local_98);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadBasicType(value::token *value) {
  // Try triple-quotated string first.
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      // TODO: preserve quotation info.
      (*value) = value::token(sdata.value);
      return true;
    }
  }

  std::string s;
  if (!ReadStringLiteral(&s)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Failed to parse string literal.");
    return false;
  }

  (*value) = value::token(s);
  return true;
}